

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalisation.cpp
# Opt level: O0

UnitList * __thiscall Shell::Normalisation::normalise(Normalisation *this,UnitList *units)

{
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  __first;
  bool bVar1;
  undefined1 uVar2;
  List<Kernel::Unit_*> *this_00;
  reference ppUVar3;
  List<Kernel::Unit_*> *in_RSI;
  int k;
  UnitList *result;
  Unit *unit;
  Iterator us;
  vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> srt;
  uint length;
  vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *in_stack_ffffffffffffff48;
  List<Kernel::Unit_*> *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *in_stack_ffffffffffffff60;
  anon_class_8_1_8991fb9c __comp;
  __normal_iterator<Kernel::Unit_**,_std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>_>
  in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  uint local_7c;
  List<Kernel::Unit_*> *local_78;
  Iterator local_40;
  Unit *in_stack_ffffffffffffffc8;
  Normalisation *in_stack_ffffffffffffffd0;
  UnitList *local_8;
  
  bVar1 = Lib::List<Kernel::Unit_*>::isEmpty(in_RSI);
  local_8 = in_RSI;
  if (!bVar1) {
    SymCounter::count((SymCounter *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      (UnitList *)in_stack_ffffffffffffff68._M_current,
                      (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    local_7c = Lib::List<Kernel::Unit_*>::length(in_stack_ffffffffffffff50);
    std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::vector
              ((vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *)0xbe9a94);
    Lib::List<Kernel::Unit_*>::Iterator::Iterator(&local_40,in_RSI);
    while (uVar2 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0xbe9ab4), (bool)uVar2)
    {
      in_stack_ffffffffffffff68._M_current =
           (Unit **)Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_ffffffffffffff50)
      ;
      normalise(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::push_back
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    __comp.this = (Normalisation *)&stack0xffffffffffffffc8;
    std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::begin(in_stack_ffffffffffffff48);
    std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::end(in_stack_ffffffffffffff48);
    __first._M_current._7_1_ = uVar2;
    __first._M_current._0_7_ = in_stack_ffffffffffffff70;
    std::
    sort<__gnu_cxx::__normal_iterator<Kernel::Unit**,std::vector<Kernel::Unit*,std::allocator<Kernel::Unit*>>>,Shell::Normalisation::normalise(Lib::List<Kernel::Unit*>*)::__0>
              (__first,in_stack_ffffffffffffff68,__comp);
    local_78 = Lib::List<Kernel::Unit_*>::empty();
    while (local_7c = local_7c - 1, -1 < (int)local_7c) {
      this_00 = (List<Kernel::Unit_*> *)Lib::List<Kernel::Unit*>::operator_new(0xbe9b97);
      ppUVar3 = std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::operator[]
                          ((vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *)
                           &stack0xffffffffffffffc8,(long)(int)local_7c);
      Lib::List<Kernel::Unit_*>::List(this_00,*ppUVar3,local_78);
      local_78 = this_00;
    }
    Lib::List<Kernel::Unit_*>::destroy((List<Kernel::Unit_*> *)__comp.this);
    local_8 = local_78;
    std::vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_>::~vector
              ((vector<Kernel::Unit_*,_std::allocator<Kernel::Unit_*>_> *)__comp.this);
  }
  return local_8;
}

Assistant:

UnitList* Normalisation::normalise (UnitList* units)
{
  if (UnitList::isEmpty(units)) {
    return units;
  }
  _counter.count(units,1);

  unsigned length = UnitList::length(units);

  // more than one literal
  std::vector<Unit *> srt;
  UnitList::Iterator us(units);
  while (us.hasNext()) {
    Unit* unit = us.next();
    normalise(unit);
    srt.push_back(unit);
  }
  sort(
    srt.begin(), srt.end(),
    [this](Unit *u1, Unit *u2) -> bool { return lessThan(u1, u2); }
  );
  UnitList* result = UnitList::empty();
  for (int k = length-1;k >= 0;k--) {
    result = new UnitList(srt[k],result);
  }
  UnitList::destroy(units);
  return result;
}